

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O1

bool argagg::convert::parse_next_component<plus_triple>(char **s,plus_triple *out_arg,char delim)

{
  char *__s;
  char *pcVar1;
  undefined7 in_register_00000011;
  string arg_str;
  char *in_stack_ffffffffffffff98;
  double local_60;
  double dStack_58;
  double local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  __s = *s;
  pcVar1 = strchr(__s,(int)CONCAT71(in_register_00000011,delim));
  *s = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)local_48,__s,(allocator *)&local_60);
    arg<plus_triple>(in_stack_ffffffffffffff98);
    out_arg->z = local_50;
    out_arg->x = local_60;
    out_arg->y = dStack_58;
    if (local_48[0] == local_38) goto LAB_0014ace7;
  }
  else {
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,__s,pcVar1);
    arg<plus_triple>(in_stack_ffffffffffffff98);
    out_arg->z = local_50;
    out_arg->x = local_60;
    out_arg->y = dStack_58;
    *s = *s + 1;
    if (local_48[0] == local_38) goto LAB_0014ace7;
  }
  operator_delete(local_48[0]);
LAB_0014ace7:
  return pcVar1 != (char *)0x0;
}

Assistant:

bool parse_next_component(
    const char*& s,
    T& out_arg,
    const char delim)
  {
    const char* begin = s;
    s = std::strchr(s, delim);
    if (s == nullptr) {
      std::string arg_str(begin);
      out_arg = argagg::convert::arg<T>(arg_str.c_str());
      return false;
    } else {
      std::string arg_str(begin, s - begin);
      out_arg = argagg::convert::arg<T>(arg_str.c_str());
      s += 1;
      return true;
    }
  }